

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::
Stack<std::unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>_>
::expand(Stack<std::unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>_>
         *this)

{
  default_delete<Lib::DArray<Kernel::TermList>_> *this_00;
  unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
  *puVar1;
  unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
  *puVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  pointer *__ptr;
  
  sVar4 = 8;
  if (this->_capacity != 0) {
    sVar4 = this->_capacity * 2;
  }
  uVar3 = sVar4 * 8;
  if (uVar3 == 0) {
    puVar2 = (unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
              *)FixedSizeAllocator<8UL>::alloc
                          ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar3 < 0x11) {
    puVar2 = (unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
              *)FixedSizeAllocator<16UL>::alloc
                          ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar3 < 0x19) {
    puVar2 = (unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
              *)FixedSizeAllocator<24UL>::alloc
                          ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar3 < 0x21) {
    puVar2 = (unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
              *)FixedSizeAllocator<32UL>::alloc
                          ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar3 < 0x31) {
    puVar2 = (unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
              *)FixedSizeAllocator<48UL>::alloc
                          ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar3 < 0x41) {
    puVar2 = (unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
              *)FixedSizeAllocator<64UL>::alloc
                          ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    puVar2 = (unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
              *)::operator_new(uVar3,0x10);
  }
  if (this->_capacity != 0) {
    uVar3 = this->_capacity;
    if (uVar3 != 0) {
      uVar5 = 0;
      do {
        puVar1 = this->_stack;
        puVar2[uVar5]._M_t.
        super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
        .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl =
             puVar1[uVar5]._M_t.
             super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
             .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl;
        puVar1[uVar5]._M_t.
        super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
        .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl =
             (DArray<Kernel::TermList> *)0x0;
        this_00 = (default_delete<Lib::DArray<Kernel::TermList>_> *)(this->_stack + uVar5);
        if (*(DArray<Kernel::TermList> **)this_00 != (DArray<Kernel::TermList> *)0x0) {
          std::default_delete<Lib::DArray<Kernel::TermList>_>::operator()
                    (this_00,*(DArray<Kernel::TermList> **)this_00);
        }
        *(undefined8 *)this_00 = 0;
        uVar5 = uVar5 + 1;
        uVar3 = this->_capacity;
      } while (uVar5 < uVar3);
    }
    puVar1 = this->_stack;
    if (puVar1 != (unique_ptr<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
                   *)0x0) {
      uVar3 = uVar3 * 8 + 0xf & 0xfffffffffffffff0;
      if (uVar3 == 0) {
        (puVar1->_M_t).
        super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
        .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl =
             (DArray<Kernel::TermList> *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = puVar1;
      }
      else if (uVar3 < 0x11) {
        (puVar1->_M_t).
        super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
        .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl =
             (DArray<Kernel::TermList> *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = puVar1;
      }
      else if (uVar3 < 0x19) {
        (puVar1->_M_t).
        super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
        .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl =
             (DArray<Kernel::TermList> *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = puVar1;
      }
      else if (uVar3 < 0x21) {
        (puVar1->_M_t).
        super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
        .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl =
             (DArray<Kernel::TermList> *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = puVar1;
      }
      else if (uVar3 < 0x31) {
        (puVar1->_M_t).
        super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
        .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl =
             (DArray<Kernel::TermList> *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = puVar1;
      }
      else if (uVar3 < 0x41) {
        (puVar1->_M_t).
        super___uniq_ptr_impl<Lib::DArray<Kernel::TermList>,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::DArray<Kernel::TermList>_*,_std::default_delete<Lib::DArray<Kernel::TermList>_>_>
        .super__Head_base<0UL,_Lib::DArray<Kernel::TermList>_*,_false>._M_head_impl =
             (DArray<Kernel::TermList> *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = puVar1;
      }
      else {
        operator_delete(puVar1,0x10);
      }
    }
  }
  this->_stack = puVar2;
  this->_cursor = puVar2 + this->_capacity;
  this->_end = puVar2 + sVar4;
  this->_capacity = sVar4;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }